

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtenvironmentvariables.cpp
# Opt level: O0

time_t qMkTime(tm *when)

{
  time_t tVar1;
  tm *in_RDI;
  long in_FS_OFFSET;
  scoped_lock<QMutex> locker;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  (anonymous_namespace)::qt_scoped_lock<QMutex,std::scoped_lock<QMutex>>((QMutex *)&local_10);
  tVar1 = mktime(in_RDI);
  std::scoped_lock<QMutex>::~scoped_lock((scoped_lock<QMutex> *)0x182e77);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return tVar1;
  }
  __stack_chk_fail();
}

Assistant:

time_t qMkTime(struct tm *when)
{
    const auto locker = qt_scoped_lock(environmentMutex);
#if defined(Q_OS_WIN)
    // QTBUG-83881 MS's mktime() seems to need _tzset() called first.
    _tzset();
#endif
    return mktime(when);
}